

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  __m256i c;
  __m256i c_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar13;
  __m256i *palVar14;
  __m256i *b_00;
  ulong uVar15;
  __m256i *palVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong size;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  undefined4 uVar24;
  __m256i *ptr;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  int32_t column_len;
  undefined1 in_stack_fffffffffffffe48 [12];
  undefined2 in_stack_fffffffffffffe54;
  short sVar37;
  undefined2 in_stack_fffffffffffffe56;
  undefined8 in_stack_fffffffffffffe58;
  int local_188;
  undefined1 auVar28 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_avx2_256_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_avx2_256_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_avx2_256_16_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sw_table_striped_profile_avx2_256_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_avx2_256_16_cold_4();
        }
        else {
          uVar18 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_avx2_256_16_cold_1();
          }
          else {
            uVar1 = (ulong)uVar2 + 0xf;
            iVar12 = ppVar4->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffff0,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 4;
              result->flag = result->flag | 0x10220804;
              b = parasail_memalign___m256i(0x20,size);
              palVar13 = parasail_memalign___m256i(0x20,size);
              palVar14 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              if ((b_00 != (__m256i *)0x0 && palVar14 != (__m256i *)0x0) &&
                  (palVar13 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
                uVar25 = (undefined2)open;
                uVar26 = (undefined2)gap;
                c[1]._4_2_ = in_stack_fffffffffffffe54;
                c._0_12_ = in_stack_fffffffffffffe48;
                c[1]._6_2_ = in_stack_fffffffffffffe56;
                c[2] = in_stack_fffffffffffffe58;
                c[3] = (longlong)palVar14;
                parasail_memset___m256i(b,c,size);
                c_00[1]._4_2_ = in_stack_fffffffffffffe54;
                c_00._0_12_ = in_stack_fffffffffffffe48;
                c_00[1]._6_2_ = in_stack_fffffffffffffe56;
                c_00[2] = in_stack_fffffffffffffe58;
                c_00[3] = (longlong)palVar14;
                parasail_memset___m256i(b_00,c_00,size);
                auVar8._2_2_ = uVar26;
                auVar8._0_2_ = uVar26;
                auVar8._4_2_ = uVar26;
                auVar8._6_2_ = uVar26;
                auVar8._8_2_ = uVar26;
                auVar8._10_2_ = uVar26;
                auVar8._12_2_ = uVar26;
                auVar8._14_2_ = uVar26;
                auVar8._16_2_ = uVar26;
                auVar8._18_2_ = uVar26;
                auVar8._20_2_ = uVar26;
                auVar8._22_2_ = uVar26;
                auVar8._24_2_ = uVar26;
                auVar8._26_2_ = uVar26;
                auVar8._28_2_ = uVar26;
                auVar8._30_2_ = uVar26;
                auVar9._2_2_ = uVar25;
                auVar9._0_2_ = uVar25;
                auVar9._4_2_ = uVar25;
                auVar9._6_2_ = uVar25;
                auVar9._8_2_ = uVar25;
                auVar9._10_2_ = uVar25;
                auVar9._12_2_ = uVar25;
                auVar9._14_2_ = uVar25;
                auVar9._16_2_ = uVar25;
                auVar9._18_2_ = uVar25;
                auVar9._20_2_ = uVar25;
                auVar9._22_2_ = uVar25;
                auVar9._24_2_ = uVar25;
                auVar9._26_2_ = uVar25;
                auVar9._28_2_ = uVar25;
                auVar9._30_2_ = uVar25;
                uVar6 = (uint)size;
                lVar21 = size * uVar18;
                auVar27._8_2_ = 0x8000;
                auVar27._0_8_ = 0x8000800080008000;
                auVar27._10_2_ = 0x8000;
                auVar27._12_2_ = 0x8000;
                auVar27._14_2_ = 0x8000;
                auVar28._16_2_ = 0x8000;
                auVar28._0_16_ = auVar27;
                auVar28._18_2_ = 0x8000;
                auVar28._20_2_ = 0x8000;
                auVar28._22_2_ = 0x8000;
                auVar28._24_2_ = 0x8000;
                auVar28._26_2_ = 0x8000;
                auVar28._28_2_ = 0x8000;
                auVar28._30_2_ = 0x8000;
                auVar29._8_2_ = 0x8000;
                auVar29._0_8_ = 0x8000800080008000;
                auVar29._10_2_ = 0x8000;
                auVar29._12_2_ = 0x8000;
                auVar29._14_2_ = 0x8000;
                auVar31 = ZEXT3264(auVar28);
                auVar30 = ZEXT3264(auVar28);
                sVar37 = -0x8000;
                lVar17 = 0;
                uVar22 = 0;
                uVar15 = 0;
                do {
                  ptr = b;
                  iVar11 = ppVar4->mapper[(byte)s2[uVar22]];
                  local_188 = (int)uVar22;
                  palVar16 = palVar14;
                  b = palVar13;
                  if ((int)uVar15 == local_188 + -2) {
                    palVar16 = palVar13;
                    b = palVar14;
                  }
                  auVar32 = SUB3216(ptr[uVar6 - 1],0);
                  auVar35._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar27;
                  auVar35._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar32;
                  auVar35 = vpalignr_avx2((undefined1  [32])ptr[uVar6 - 1],auVar35,0xe);
                  auVar32 = vpblendw_avx(auVar35._0_16_,auVar27,1);
                  auVar35 = vpblendd_avx2(ZEXT1632(auVar32),auVar35,0xf0);
                  lVar19 = 0;
                  auVar34 = ZEXT3264(auVar28);
                  lVar23 = lVar17;
                  do {
                    auVar36 = vpaddsw_avx2(auVar35,*(undefined1 (*) [32])
                                                    ((long)pvVar3 +
                                                    lVar19 + size * (long)iVar11 * 0x20));
                    auVar35 = *(undefined1 (*) [32])((long)*b_00 + lVar19);
                    auVar33 = vpmaxsw_avx2(auVar35,auVar34._0_32_);
                    auVar36 = vpmaxsw_avx2(auVar36,auVar33);
                    *(undefined1 (*) [32])((long)*b + lVar19) = auVar36;
                    piVar5 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar23) = auVar36._0_2_ + 0x8000;
                    auVar32 = auVar36._0_16_;
                    uVar10 = vpextrw_avx(auVar32,1);
                    *(int *)((long)piVar5 + lVar21 * 4 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,2);
                    uVar24 = vpextrw_avx(auVar32,3);
                    *(int *)((long)piVar5 + lVar21 * 8 + lVar23) = (short)uVar10 + 0x8000;
                    *(int *)((long)piVar5 + lVar21 * 0xc + lVar23) = (short)uVar24 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,4);
                    *(int *)((long)piVar5 + lVar21 * 0x10 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,5);
                    *(int *)((long)piVar5 + lVar21 * 0x14 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,6);
                    uVar24 = vpextrw_avx(auVar32,7);
                    *(int *)((long)piVar5 + lVar21 * 0x18 + lVar23) = (short)uVar10 + 0x8000;
                    *(int *)((long)piVar5 + lVar21 * 0x1c + lVar23) = (short)uVar24 + 0x8000;
                    auVar32 = auVar36._16_16_;
                    *(int *)((long)piVar5 + lVar21 * 0x20 + lVar23) = auVar36._16_2_ + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,1);
                    *(int *)((long)piVar5 + lVar21 * 0x24 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,2);
                    uVar24 = vpextrw_avx(auVar32,3);
                    *(int *)((long)piVar5 + lVar21 * 0x28 + lVar23) = (short)uVar10 + 0x8000;
                    *(int *)((long)piVar5 + lVar21 * 0x2c + lVar23) = (short)uVar24 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,4);
                    *(int *)((long)piVar5 + lVar21 * 0x30 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,5);
                    *(int *)((long)piVar5 + lVar21 * 0x34 + lVar23) = (short)uVar10 + 0x8000;
                    uVar10 = vpextrw_avx(auVar32,6);
                    uVar24 = vpextrw_avx(auVar32,7);
                    *(int *)((long)piVar5 + lVar21 * 0x38 + lVar23) = (short)uVar10 + 0x8000;
                    *(int *)((long)piVar5 + lVar21 * 0x3c + lVar23) = (short)uVar24 + 0x8000;
                    auVar33 = vpmaxsw_avx2(auVar36,auVar30._0_32_);
                    auVar30 = ZEXT3264(auVar33);
                    auVar36 = vpsubsw_avx2(auVar36,auVar9);
                    auVar35 = vpsubsw_avx2(auVar35,auVar8);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    *(undefined1 (*) [32])((long)*b_00 + lVar19) = auVar35;
                    auVar35 = vpsubsw_avx2(auVar34._0_32_,auVar8);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    auVar34 = ZEXT3264(auVar35);
                    auVar35 = *(undefined1 (*) [32])((long)*ptr + lVar19);
                    lVar19 = lVar19 + 0x20;
                    lVar23 = lVar23 + uVar18 * 4;
                  } while (size << 5 != lVar19);
                  iVar11 = 0;
                  do {
                    auVar36._0_16_ = ZEXT116(0) * auVar34._0_16_ + ZEXT116(1) * auVar27;
                    auVar36._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar34._0_16_;
                    auVar35 = vpalignr_avx2(auVar34._0_32_,auVar36,0xe);
                    auVar32 = vpblendw_avx(auVar35._0_16_,auVar29,1);
                    auVar35 = vpblendd_avx2(ZEXT1632(auVar32),auVar35,0xf0);
                    auVar34 = ZEXT3264(auVar35);
                    lVar19 = 0;
                    lVar23 = lVar17;
                    do {
                      auVar35 = vpmaxsw_avx2(auVar34._0_32_,
                                             *(undefined1 (*) [32])((long)*b + lVar19));
                      *(undefined1 (*) [32])((long)*b + lVar19) = auVar35;
                      piVar5 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar23) = auVar35._0_2_ + 0x8000;
                      auVar32 = auVar35._0_16_;
                      uVar10 = vpextrw_avx(auVar32,1);
                      *(int *)((long)piVar5 + lVar21 * 4 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,2);
                      *(int *)((long)piVar5 + lVar21 * 8 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,3);
                      *(int *)((long)piVar5 + lVar21 * 0xc + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,4);
                      uVar24 = vpextrw_avx(auVar32,5);
                      *(int *)((long)piVar5 + lVar21 * 0x10 + lVar23) = (short)uVar10 + 0x8000;
                      *(int *)((long)piVar5 + lVar21 * 0x14 + lVar23) = (short)uVar24 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,6);
                      *(int *)((long)piVar5 + lVar21 * 0x18 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,7);
                      *(int *)((long)piVar5 + lVar21 * 0x1c + lVar23) = (short)uVar10 + 0x8000;
                      auVar32 = auVar35._16_16_;
                      uVar10 = vpextrw_avx(auVar32,1);
                      *(int *)((long)piVar5 + lVar21 * 0x20 + lVar23) = auVar35._16_2_ + 0x8000;
                      *(int *)((long)piVar5 + lVar21 * 0x24 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,2);
                      *(int *)((long)piVar5 + lVar21 * 0x28 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,3);
                      *(int *)((long)piVar5 + lVar21 * 0x2c + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,4);
                      uVar24 = vpextrw_avx(auVar32,5);
                      *(int *)((long)piVar5 + lVar21 * 0x30 + lVar23) = (short)uVar10 + 0x8000;
                      *(int *)((long)piVar5 + lVar21 * 0x34 + lVar23) = (short)uVar24 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,6);
                      *(int *)((long)piVar5 + lVar21 * 0x38 + lVar23) = (short)uVar10 + 0x8000;
                      uVar10 = vpextrw_avx(auVar32,7);
                      *(int *)((long)piVar5 + lVar21 * 0x3c + lVar23) = (short)uVar10 + 0x8000;
                      auVar36 = vpmaxsw_avx2(auVar35,auVar30._0_32_);
                      auVar30 = ZEXT3264(auVar36);
                      auVar35 = vpsubsw_avx2(auVar35,auVar9);
                      auVar33 = vpsubsw_avx2(auVar34._0_32_,auVar8);
                      auVar34 = ZEXT3264(auVar33);
                      auVar35 = vpcmpgtw_avx2(auVar33,auVar35);
                      if ((((((((((((((((((((((((((((((((auVar35 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar35 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar35 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar35 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar35 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar35 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar35 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar35 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar35 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar35 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar35 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar35 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar35 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar35 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar35 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar35 >> 0x7f,0) == '\0') &&
                                        (auVar35 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar35 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar35 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar35 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar35 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar35 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar35 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar35 >> 0xbf,0) == '\0') &&
                                (auVar35 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar35 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar35 >> 0xd7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar35 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar35 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar35 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar35 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar35[0x1f]) goto LAB_0079943b;
                      lVar19 = lVar19 + 0x20;
                      lVar23 = lVar23 + uVar18 * 4;
                    } while (size << 5 != lVar19);
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != 0x10);
LAB_0079943b:
                  auVar35 = vpcmpgtw_avx2(auVar36,auVar31._0_32_);
                  bVar7 = true;
                  if ((((((((((((((((((((((((((((((((auVar35 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar35 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar35 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar35 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar35 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar35 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar35 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar35 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar35 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar35 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar35 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar35 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar35 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar35 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar35 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar35 >> 0x7f,0) != '\0')
                                    || (auVar35 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar35 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar35 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar35 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar35 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar35 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar35 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar35 >> 0xbf,0) != '\0') ||
                            (auVar35 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar35 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar35 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar35 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar35 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar35 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar35 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar35[0x1f] < '\0') {
                    auVar35 = vpermq_avx2(auVar36,0x44);
                    auVar35 = vpmaxsw_avx2(auVar36,auVar35);
                    auVar36 = vpslldq_avx2(auVar35,8);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    auVar36 = vpslldq_avx2(auVar35,4);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    auVar36 = vpslldq_avx2(auVar35,2);
                    auVar35 = vpmaxsw_avx2(auVar35,auVar36);
                    uVar10 = vpextrw_avx(auVar35._16_16_,7);
                    sVar37 = (short)uVar10;
                    if ((short)(0x7ffe - (short)iVar12) < sVar37) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar7 = false;
                    }
                    else {
                      auVar35 = vpshufhw_avx2(auVar35,0xff);
                      auVar33._8_4_ = 6;
                      auVar33._0_8_ = 0x600000006;
                      auVar33._12_4_ = 6;
                      auVar33._16_4_ = 6;
                      auVar33._20_4_ = 6;
                      auVar33._24_4_ = 6;
                      auVar33._28_4_ = 6;
                      auVar35 = vpermd_avx2(auVar33,auVar35);
                      auVar31 = ZEXT3264(auVar35);
                      uVar15 = uVar22 & 0xffffffff;
                    }
                  }
                  if (!bVar7) break;
                  uVar22 = uVar22 + 1;
                  lVar17 = lVar17 + 4;
                  palVar13 = ptr;
                  palVar14 = palVar16;
                  local_188 = s2Len;
                } while (uVar22 != uVar18);
                if (sVar37 == 0x7fff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar12 = parasail_result_is_saturated(result);
                palVar13 = palVar16;
                if (iVar12 == 0) {
                  iVar12 = (int)uVar15;
                  palVar14 = ptr;
                  if (iVar12 == local_188 + -2) {
                    palVar13 = ptr;
                    palVar14 = palVar16;
                  }
                  if (iVar12 == local_188 + -1) {
                    palVar13 = b;
                    b = palVar16;
                    palVar14 = ptr;
                  }
                  ptr = palVar14;
                  iVar11 = uVar2 - 1;
                  if ((uVar1 & 0x7ffffff0) != 0) {
                    uVar18 = 0;
                    do {
                      if ((*(short *)((long)*palVar13 + uVar18 * 2) == sVar37) &&
                         (iVar20 = ((uint)uVar18 & 0xf) * uVar6 + ((uint)(uVar18 >> 4) & 0xfffffff),
                         iVar20 < iVar11)) {
                        iVar11 = iVar20;
                      }
                      uVar18 = uVar18 + 1;
                    } while ((uVar6 & 0x7ffffff) << 4 != (int)uVar18);
                  }
                  iVar20 = sVar37 + 0x8000;
                }
                else {
                  iVar12 = 0;
                  iVar20 = 0xffff;
                  iVar11 = 0;
                }
                result->score = iVar20;
                result->end_query = iVar11;
                result->end_ref = iVar12;
                parasail_free(b_00);
                parasail_free(palVar13);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int16_t bias = 0;
    int16_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int16_t maxp = 0;
    __m256i insert_mask;
    /*int16_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    bias = INT16_MIN;
    score = bias;
    vBias = _mm256_set1_epi16(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi16(
            _mm256_set_epi16(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT16_MAX : (int16_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 2);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi16(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi16(vH, vE);
            vH = _mm256_max_epi16(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi16(vH, vGapO);
            vE = _mm256_subs_epi16(vE, vGapE);
            vE = _mm256_max_epi16(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 2);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi16(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vH = _mm256_subs_epi16(vH, vGapO);
                vF = _mm256_subs_epi16(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm256_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT16_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}